

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_24::Inhabitator::markNullable(Inhabitator *this,FieldPos field)

{
  anon_class_16_2_f7f469bf func;
  bool bVar1;
  Variance VVar2;
  type *this_00;
  type *__y;
  HeapType *pHVar3;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_01;
  size_type sVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  pair<std::__detail::_Node_iterator<std::pair<wasm::HeapType,_unsigned_int>,_true,_true>,_bool>
  pVar5;
  FieldPos fieldPos;
  ulong local_c0;
  size_t index;
  optional<wasm::HeapType> super_2;
  optional<wasm::HeapType> super_1;
  pair<wasm::HeapType,_unsigned_int> local_88;
  _Storage<wasm::HeapType,_true> local_78;
  optional<wasm::HeapType> super;
  type *idx;
  type *curr;
  undefined8 uStack_40;
  _Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true> local_30;
  undefined1 local_28;
  Inhabitator *local_20;
  Inhabitator *this_local;
  FieldPos field_local;
  
  this_local = (Inhabitator *)field.first.id;
  field_local.first.id._0_4_ = field.second;
  local_20 = this;
  pVar5 = std::
          unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          ::insert(&this->nullables,(value_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       pVar5.first.super__Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true>._M_cur;
  local_28 = pVar5.second;
  uStack_40._4_4_ = field_local.first.id._4_4_;
  uStack_40._0_4_ = (uint)field_local.first.id;
  curr = (type *)this_local;
  this_00 = std::get<0ul,wasm::HeapType,unsigned_int>((pair<wasm::HeapType,_unsigned_int> *)&curr);
  __y = std::get<1ul,wasm::HeapType,unsigned_int>((pair<wasm::HeapType,_unsigned_int> *)&curr);
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = this_local;
  fieldPos.second = (uint)field_local.first.id;
  fieldPos.first.id = (uintptr_t)this_local;
  fieldPos._12_4_ = 0;
  VVar2 = getVariance(this,fieldPos);
  if (VVar2 == Invariant) {
    bVar1 = HeapType::isArray(this_00);
    if (bVar1) {
      while( true ) {
        super_2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = wasm::HeapType::getDeclaredSuperType();
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &super_2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if (!bVar1) break;
        pHVar3 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)
                            &super_2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_engaged);
        this_00->id = pHVar3->id;
      }
    }
    else {
      bVar1 = HeapType::isStruct(this_00);
      if (!bVar1) {
        __assert_fail("curr.isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x2e6,"void wasm::(anonymous namespace)::Inhabitator::markNullable(FieldPos)"
                     );
      }
      while( true ) {
        index = wasm::HeapType::getDeclaredSuperType();
        super_2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL_00;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&index);
        if (!bVar1) break;
        std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&index);
        this_01 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)wasm::HeapType::getStruct();
        sVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(this_01);
        if (sVar4 <= *__y) break;
        pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&index);
        this_00->id = pHVar3->id;
      }
    }
    local_c0 = (ulong)*__y;
    func.index = &local_c0;
    func.this = this;
    SubTypes::
    iterSubTypes<wasm::(anonymous_namespace)::Inhabitator::markNullable(std::pair<wasm::HeapType,unsigned_int>)::__0>
              (&this->subtypes,(HeapType)this_00->id,func);
  }
  else if (VVar2 == Covariant) {
    while( true ) {
      local_78 = (_Storage<wasm::HeapType,_true>)wasm::HeapType::getDeclaredSuperType();
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_78._M_value);
      if (!bVar1) break;
      pHVar3 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_78._M_value);
      std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_int_&,_true>
                (&local_88,pHVar3,__y);
      std::
      unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      ::insert(&this->nullables,&local_88);
      pHVar3 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_78._M_value);
      this_00->id = pHVar3->id;
    }
  }
  return;
}

Assistant:

void Inhabitator::markNullable(FieldPos field) {
  // Mark the given field nullable in the original type and in other types
  // necessary to keep subtyping valid.
  nullables.insert(field);
  auto [curr, idx] = field;
  switch (getVariance(field)) {
    case Covariant:
      // Mark the field null in all supertypes. If the supertype field is
      // already nullable or does not exist, that's ok and this will have no
      // effect.
      while (auto super = curr.getDeclaredSuperType()) {
        nullables.insert({*super, idx});
        curr = *super;
      }
      break;
    case Invariant:
      // Find the top type for which this field exists and mark the field
      // nullable in all of its subtypes.
      if (curr.isArray()) {
        while (auto super = curr.getDeclaredSuperType()) {
          curr = *super;
        }
      } else {
        assert(curr.isStruct());
        while (auto super = curr.getDeclaredSuperType()) {
          if (super->getStruct().fields.size() <= idx) {
            break;
          }
          curr = *super;
        }
      }
      // Mark the field nullable in all subtypes. If the subtype field is
      // already nullable, that's ok and this will have no effect. TODO: Remove
      // this extra `index` variable once we have C++20. It's a workaround for
      // lambdas being unable to capture structured bindings.
      const size_t index = idx;
      subtypes.iterSubTypes(curr, [&](HeapType type, Index) {
        nullables.insert({type, index});
      });
      break;
  }
}